

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O0

QCborValue * __thiscall QJsonPrivate::Parser::parseValue(Parser *this)

{
  char cVar1;
  QCborContainerPrivate *pQVar2;
  bool bVar3;
  StashedContainer *in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  StashedContainer stashedContainer_1;
  StashedContainer stashedContainer;
  QExplicitlySharedDataPointer<QCborContainerPrivate> *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  Parser *pPVar4;
  Parser *in_stack_ffffffffffffffe8;
  Parser *this_00;
  
  this_00 = *(Parser **)(in_FS_OFFSET + 0x28);
  pQVar2 = (in_RSI->stashed).d.ptr;
  (in_RSI->stashed).d.ptr =
       (QCborContainerPrivate *)
       ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
  cVar1 = *(char *)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>;
  pPVar4 = in_RDI;
  if (cVar1 == '\"') {
    bVar3 = parseString(in_stack_ffffffffffffffe8);
    if (bVar3) {
      ::QCborValue::QCborValue((QCborValue *)in_RDI,String);
    }
    else {
      ::QCborValue::QCborValue((QCborValue *)in_RDI);
    }
  }
  else if (cVar1 == ',') {
    *(undefined4 *)((long)&in_RSI[1].stashed.d.ptr + 4) = 5;
    ::QCborValue::QCborValue((QCborValue *)in_RDI);
    pPVar4 = in_RDI;
  }
  else if (cVar1 == '[') {
    StashedContainer::StashedContainer
              ((StashedContainer *)
               CONCAT17(in_stack_ffffffffffffff97,
                        CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
               in_stack_ffffffffffffff88,Integer);
    bVar3 = parseArray(in_RDI);
    if (bVar3) {
      StashedContainer::intoValue
                (in_RSI,(QExplicitlySharedDataPointer<QCborContainerPrivate> *)pPVar4);
    }
    else {
      ::QCborValue::QCborValue((QCborValue *)in_RDI);
    }
    StashedContainer::~StashedContainer((StashedContainer *)0x4971a7);
  }
  else {
    if (cVar1 != ']') {
      if (cVar1 == 'f') {
        if (*(long *)(in_RSI + 1) - (long)(in_RSI->stashed).d.ptr < 4) {
          *(undefined4 *)((long)&in_RSI[1].stashed.d.ptr + 4) = 5;
          ::QCborValue::QCborValue((QCborValue *)in_RDI);
          pPVar4 = in_RDI;
        }
        else {
          pQVar2 = (in_RSI->stashed).d.ptr;
          (in_RSI->stashed).d.ptr =
               (QCborContainerPrivate *)
               ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
          if ((((*(char *)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 'a')
               && (pQVar2 = (in_RSI->stashed).d.ptr,
                  (in_RSI->stashed).d.ptr =
                       (QCborContainerPrivate *)
                       ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1)
                  , *(char *)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> ==
                    'l')) &&
              (pQVar2 = (in_RSI->stashed).d.ptr,
              (in_RSI->stashed).d.ptr =
                   (QCborContainerPrivate *)
                   ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1),
              *(char *)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 's')) &&
             (pQVar2 = (in_RSI->stashed).d.ptr,
             (in_RSI->stashed).d.ptr =
                  (QCborContainerPrivate *)
                  ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1),
             *(char *)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 'e')) {
            ::QCborValue::QCborValue((QCborValue *)in_RDI,false);
            pPVar4 = in_RDI;
          }
          else {
            *(undefined4 *)((long)&in_RSI[1].stashed.d.ptr + 4) = 5;
            ::QCborValue::QCborValue((QCborValue *)in_RDI);
            pPVar4 = in_RDI;
          }
        }
        goto LAB_0049729a;
      }
      if (cVar1 == 'n') {
        if (*(long *)(in_RSI + 1) - (long)(in_RSI->stashed).d.ptr < 3) {
          *(undefined4 *)((long)&in_RSI[1].stashed.d.ptr + 4) = 5;
          ::QCborValue::QCborValue((QCborValue *)in_RDI);
          pPVar4 = in_RDI;
        }
        else {
          pQVar2 = (in_RSI->stashed).d.ptr;
          (in_RSI->stashed).d.ptr =
               (QCborContainerPrivate *)
               ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
          if (((*(char *)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 'u')
              && (pQVar2 = (in_RSI->stashed).d.ptr,
                 (in_RSI->stashed).d.ptr =
                      (QCborContainerPrivate *)
                      ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1),
                 *(char *)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 'l'))
             && (pQVar2 = (in_RSI->stashed).d.ptr,
                (in_RSI->stashed).d.ptr =
                     (QCborContainerPrivate *)
                     ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1),
                *(char *)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 'l'))
          {
            ::QCborValue::QCborValue((QCborValue *)in_RDI,Null);
            pPVar4 = in_RDI;
          }
          else {
            *(undefined4 *)((long)&in_RSI[1].stashed.d.ptr + 4) = 5;
            ::QCborValue::QCborValue((QCborValue *)in_RDI);
            pPVar4 = in_RDI;
          }
        }
        goto LAB_0049729a;
      }
      if (cVar1 == 't') {
        if (*(long *)(in_RSI + 1) - (long)(in_RSI->stashed).d.ptr < 3) {
          *(undefined4 *)((long)&in_RSI[1].stashed.d.ptr + 4) = 5;
          ::QCborValue::QCborValue((QCborValue *)in_RDI);
          pPVar4 = in_RDI;
        }
        else {
          pQVar2 = (in_RSI->stashed).d.ptr;
          (in_RSI->stashed).d.ptr =
               (QCborContainerPrivate *)
               ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
          if (((*(char *)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 'r')
              && (pQVar2 = (in_RSI->stashed).d.ptr,
                 (in_RSI->stashed).d.ptr =
                      (QCborContainerPrivate *)
                      ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1),
                 *(char *)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 'u'))
             && (pQVar2 = (in_RSI->stashed).d.ptr,
                (in_RSI->stashed).d.ptr =
                     (QCborContainerPrivate *)
                     ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1),
                *(char *)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 'e'))
          {
            ::QCborValue::QCborValue((QCborValue *)in_RDI,true);
            pPVar4 = in_RDI;
          }
          else {
            *(undefined4 *)((long)&in_RSI[1].stashed.d.ptr + 4) = 5;
            ::QCborValue::QCborValue((QCborValue *)in_RDI);
            pPVar4 = in_RDI;
          }
        }
        goto LAB_0049729a;
      }
      if (cVar1 == '{') {
        StashedContainer::StashedContainer
                  ((StashedContainer *)
                   CONCAT17(in_stack_ffffffffffffff97,
                            CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                   in_stack_ffffffffffffff88,Integer);
        bVar3 = parseObject(in_RDI);
        if (bVar3) {
          StashedContainer::intoValue
                    (in_RSI,(QExplicitlySharedDataPointer<QCborContainerPrivate> *)pPVar4);
        }
        else {
          ::QCborValue::QCborValue((QCborValue *)in_RDI);
        }
        StashedContainer::~StashedContainer((StashedContainer *)0x49724d);
        goto LAB_0049729a;
      }
      if (cVar1 != '}') {
        (in_RSI->stashed).d.ptr =
             (QCborContainerPrivate *)((long)&(in_RSI->stashed).d.ptr[-1].elements.d.size + 7);
        parseNumber(this_00);
        pPVar4 = in_RDI;
        goto LAB_0049729a;
      }
    }
    *(undefined4 *)((long)&in_RSI[1].stashed.d.ptr + 4) = 0xb;
    ::QCborValue::QCborValue((QCborValue *)in_RDI);
    pPVar4 = in_RDI;
  }
LAB_0049729a:
  if (*(Parser **)(in_FS_OFFSET + 0x28) == this_00) {
    return (QCborValue *)pPVar4;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue Parser::parseValue()
{
    switch (*json++) {
    case 'n':
        if (end - json < 3) {
            lastError = QJsonParseError::IllegalValue;
            return QCborValue();
        }
        if (*json++ == 'u' &&
            *json++ == 'l' &&
            *json++ == 'l') {
            return QCborValue(QCborValue::Null);
        }
        lastError = QJsonParseError::IllegalValue;
        return QCborValue();
    case 't':
        if (end - json < 3) {
            lastError = QJsonParseError::IllegalValue;
            return QCborValue();
        }
        if (*json++ == 'r' &&
            *json++ == 'u' &&
            *json++ == 'e') {
            return QCborValue(true);
        }
        lastError = QJsonParseError::IllegalValue;
        return QCborValue();
    case 'f':
        if (end - json < 4) {
            lastError = QJsonParseError::IllegalValue;
            return QCborValue();
        }
        if (*json++ == 'a' &&
            *json++ == 'l' &&
            *json++ == 's' &&
            *json++ == 'e') {
            return QCborValue(false);
        }
        lastError = QJsonParseError::IllegalValue;
        return QCborValue();
    case Quote: {
        if (parseString())
            // strings are already added to the container
            // callers must check for this type
            return QCborValue(QCborValue::String);

        return QCborValue();
    }
    case BeginArray: {
        StashedContainer stashedContainer(&container, QCborValue::Array);
        if (parseArray())
            return stashedContainer.intoValue(&container);

        return QCborValue();
    }
    case BeginObject: {
        StashedContainer stashedContainer(&container, QCborValue::Map);
        if (parseObject())
            return stashedContainer.intoValue(&container);

        return QCborValue();
    }
    case ValueSeparator:
        // Essentially missing value, but after a colon, not after a comma
        // like the other MissingObject errors.
        lastError = QJsonParseError::IllegalValue;
        return QCborValue();
    case EndObject:
    case EndArray:
        lastError = QJsonParseError::MissingObject;
        return QCborValue();
    default:
        --json;
        return parseNumber();
    }
}